

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
          (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *this,uint new_capacity)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> tmp;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_stack_ffffffffffffffd0;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_stack_ffffffffffffffd8;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> local_20;
  uint local_c;
  
  if (*(uint *)(in_RDI + 0xc) < in_ESI) {
    increase_capacity((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb,
                      (bool)in_stack_ffffffffffffffba);
  }
  else if (in_ESI < *(uint *)(in_RDI + 0xc)) {
    local_c = in_ESI;
    vector(&local_20);
    uVar1 = math::maximum<unsigned_int>(*(uint *)(in_RDI + 8),local_c);
    increase_capacity((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
                      CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                      (bool)in_stack_ffffffffffffffbb,(bool)in_stack_ffffffffffffffba);
    operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    swap((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
         CONCAT44(uVar1,in_stack_ffffffffffffffc0),
         (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
         CONCAT44(in_stack_ffffffffffffffbc,
                  CONCAT13(in_stack_ffffffffffffffbb,
                           CONCAT12(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8))));
    ~vector((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
            CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }